

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void __thiscall cmCacheManager::CacheIterator::Next(CacheIterator *this)

{
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  
  p_Var1 = (this->Position)._M_node;
  if ((_Rb_tree_header *)p_Var1 != &(this->Container->Cache)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    (this->Position)._M_node = p_Var2;
  }
  return;
}

Assistant:

void cmCacheManager::CacheIterator::Next()
{
  if (!this->IsAtEnd()) {
    ++this->Position;
  }
}